

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.h
# Opt level: O1

LPCWSTR WScriptJsrt::ConvertErrorCodeToMessage(JsErrorCode errorCode)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  char *in_RCX;
  byte *_Src;
  ulong _SizeInBytes;
  byte *_Src_00;
  char *in_RSI;
  byte *_Src_01;
  byte *pbVar4;
  undefined4 in_register_0000003c;
  ulong in_R8;
  char *in_R9;
  byte *pbVar5;
  ulong unaff_retaddr;
  char *in_stack_00000008;
  ulong in_stack_00000010;
  uint uStack_58;
  
  _Src = (byte *)CONCAT44(in_register_0000003c,errorCode);
  if ((int)errorCode < 0x20001) {
    _Src = (byte *)(ulong)(errorCode - JsErrorInvalidArgument);
    if (errorCode - JsErrorInvalidArgument < 0xc) {
      in_RCX = (char *)((long)&switchD_00113479::switchdataD_00166a78 +
                       (long)(int)(&switchD_00113479::switchdataD_00166a78)[(long)_Src]);
      switch(_Src) {
      case (byte *)0x0:
        return L"TypeError: InvalidArgument";
      case (byte *)0x1:
        return L"TypeError: NullArgument";
      case (byte *)0x3:
        return L"ErrorInExceptionState";
      case (byte *)0x7:
        return L"ErrorBadSerializedScript ";
      case (byte *)0xb:
        return L"TypeError: ArgumentNotAnObject";
      }
    }
  }
  else if ((int)errorCode < 0x30002) {
    if (errorCode == JsErrorOutOfMemory) {
      return L"OutOfMemory";
    }
    if (errorCode == JsErrorScriptException) {
      return L"ScriptError";
    }
  }
  else {
    if (errorCode == JsErrorScriptCompile) {
      return L"SyntaxError";
    }
    if (errorCode == JsErrorFatal) {
      return L"FatalError";
    }
  }
  ConvertErrorCodeToMessage();
  if (_Src == (byte *)0x0) {
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    uStack_58 = 0x16;
    goto LAB_00113969;
  }
  uStack_58 = 0x16;
  if (((((in_RSI == (char *)0x0 && _SizeInBytes != 0) ||
        (in_RSI != (char *)0x0 && _SizeInBytes == 0)) || (in_RCX == (char *)0x0 && in_R8 != 0)) ||
      ((in_RCX != (char *)0x0 && in_R8 == 0 || (in_R9 == (char *)0x0 && unaff_retaddr != 0)))) ||
     ((in_R9 != (char *)0x0 && unaff_retaddr == 0 ||
      ((in_stack_00000008 == (char *)0x0 && in_stack_00000010 != 0 ||
       (in_stack_00000008 != (char *)0x0 && in_stack_00000010 == 0)))))) goto LAB_00113855;
  if ((*_Src == 0x5c) && ((_Src[1] == 0x5c && (_Src[2] == 0x3f)))) {
    _Src = _Src + (ulong)(_Src[3] == 0x5c) * 4;
  }
  bVar1 = *_Src;
  if (_Src[bVar1 != 0] == 0x3a) {
    if (in_RSI != (char *)0x0) {
      if (_SizeInBytes < 3) {
        bVar2 = false;
        goto LAB_001136a3;
      }
      strncpy_s(in_RSI,_SizeInBytes,(char *)_Src,2);
    }
    _Src = _Src + (bVar1 != 0) + 1;
    bVar2 = true;
  }
  else {
    bVar2 = true;
    if ((in_RSI != (char *)0x0) && (*in_RSI = '\0', 1 < _SizeInBytes)) {
      memset(in_RSI + 1,0xfd,_SizeInBytes - 1);
      bVar2 = true;
    }
  }
LAB_001136a3:
  uStack_58 = 0x22;
  if (bVar2) {
    _Src_00 = (byte *)0x0;
    pbVar3 = _Src;
    _Src_01 = (byte *)0x0;
    pbVar5 = _Src;
    do {
      bVar1 = *pbVar3;
      pbVar4 = _Src_01;
      if (bVar1 < 0x2f) {
        pbVar4 = pbVar3;
        if ((bVar1 != 0x2e) && (pbVar4 = _Src_01, bVar1 == 0)) goto LAB_001136e7;
      }
      else if ((bVar1 == 0x5c) || (bVar1 == 0x2f)) {
        _Src_00 = pbVar3 + 1;
      }
      pbVar3 = pbVar3 + 1;
      pbVar5 = pbVar5 + 1;
      _Src_01 = pbVar4;
    } while( true );
  }
LAB_00113855:
  if ((in_RSI != (char *)0x0 && _SizeInBytes != 0) && (*in_RSI = '\0', 1 < _SizeInBytes)) {
    memset(in_RSI + 1,0xfd,_SizeInBytes - 1);
  }
  if ((in_R8 != 0 && in_RCX != (char *)0x0) && (*in_RCX = '\0', 1 < in_R8)) {
    memset(in_RCX + 1,0xfd,in_R8 - 1);
  }
  if ((unaff_retaddr != 0 && in_R9 != (char *)0x0) && (*in_R9 = '\0', 1 < unaff_retaddr)) {
    memset(in_R9 + 1,0xfd,unaff_retaddr - 1);
  }
  if ((in_stack_00000010 != 0 && in_stack_00000008 != (char *)0x0) &&
     (*in_stack_00000008 = '\0', 1 < in_stack_00000010)) {
    memset(in_stack_00000008 + 1,0xfd,in_stack_00000010 - 1);
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_00113969:
  return (LPCWSTR)(ulong)uStack_58;
LAB_001136e7:
  if (_Src_00 == (byte *)0x0) {
    _Src_00 = _Src;
    if ((in_RCX != (char *)0x0) && (*in_RCX = '\0', 1 < in_R8)) {
      memset(in_RCX + 1,0xfd,in_R8 - 1);
    }
  }
  else if (in_RCX != (char *)0x0) {
    if (in_R8 <= (ulong)((long)_Src_00 - (long)_Src)) goto LAB_00113855;
    strncpy_s(in_RCX,in_R8,(char *)_Src,(long)_Src_00 - (long)_Src);
  }
  if (_Src_00 <= _Src_01 && _Src_01 != (byte *)0x0) {
    if (in_R9 != (char *)0x0) {
      if (unaff_retaddr <= (ulong)((long)_Src_01 - (long)_Src_00)) goto LAB_00113855;
      strncpy_s(in_R9,unaff_retaddr,(char *)_Src_00,(long)_Src_01 - (long)_Src_00);
    }
    if (in_stack_00000008 != (char *)0x0) {
      if (in_stack_00000010 <= (ulong)((long)pbVar5 - (long)_Src_01)) goto LAB_00113855;
      strncpy_s(in_stack_00000008,in_stack_00000010,(char *)_Src_01,(long)pbVar5 - (long)_Src_01);
    }
    uStack_58 = 0;
    goto LAB_00113969;
  }
  if (in_R9 != (char *)0x0) {
    if (unaff_retaddr <= (ulong)((long)pbVar5 - (long)_Src_00)) goto LAB_00113855;
    strncpy_s(in_R9,unaff_retaddr,(char *)_Src_00,(long)pbVar5 - (long)_Src_00);
  }
  uStack_58 = 0;
  if ((in_stack_00000008 != (char *)0x0) &&
     (*in_stack_00000008 = '\0', uStack_58 = 0, 1 < in_stack_00000010)) {
    memset(in_stack_00000008 + 1,0xfd,in_stack_00000010 - 1);
  }
  goto LAB_00113969;
}

Assistant:

static LPCWSTR ConvertErrorCodeToMessage(JsErrorCode errorCode)
    {
        switch (errorCode)
        {
        case (JsErrorCode::JsErrorInvalidArgument) :
            return _u("TypeError: InvalidArgument");
        case (JsErrorCode::JsErrorNullArgument) :
            return _u("TypeError: NullArgument");
        case (JsErrorCode::JsErrorArgumentNotObject) :
            return _u("TypeError: ArgumentNotAnObject");
        case (JsErrorCode::JsErrorOutOfMemory) :
            return _u("OutOfMemory");
        case (JsErrorCode::JsErrorScriptException) :
            return _u("ScriptError");
        case (JsErrorCode::JsErrorScriptCompile) :
            return _u("SyntaxError");
        case (JsErrorCode::JsErrorFatal) :
            return _u("FatalError");
        case (JsErrorCode::JsErrorInExceptionState) :
            return _u("ErrorInExceptionState");
        case (JsErrorCode::JsErrorBadSerializedScript):
            return _u("ErrorBadSerializedScript ");
        default:
            AssertMsg(false, "Unexpected JsErrorCode");
            return nullptr;
        }
    }